

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void __thiscall btLCP::transfer_i_from_N_to_C(btLCP *this,int i)

{
  int iVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  int *piVar4;
  btScalar *aptr;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  float fVar12;
  int in_stack_ffffffffffffffe0;
  
  iVar1 = this->m_nC;
  pbVar2 = this->m_A[i];
  if ((long)iVar1 < 1) {
    *this->m_d = 1.0 / pbVar2[i];
  }
  else {
    pbVar3 = this->m_Dell;
    piVar4 = this->m_C;
    iVar11 = this->m_nub;
    uVar8 = 0;
    if (0 < (long)iVar11) {
      do {
        pbVar3[uVar8] = pbVar2[uVar8];
        uVar8 = uVar8 + 1;
      } while ((long)iVar11 != uVar8);
    }
    if ((int)uVar8 < iVar1) {
      uVar8 = uVar8 & 0xffffffff;
      do {
        pbVar3[uVar8] = pbVar2[piVar4[uVar8]];
        uVar8 = uVar8 + 1;
      } while ((long)iVar1 != uVar8);
    }
    in_stack_ffffffffffffffe0 = 0x1d1576;
    btSolveL1(this->m_L,pbVar3,iVar1,this->m_nskip);
    iVar1 = this->m_nC;
    lVar5 = (long)iVar1;
    pfVar6 = this->m_ell;
    pbVar2 = this->m_d;
    pfVar7 = this->m_Dell;
    if (0 < lVar5) {
      iVar11 = this->m_nskip;
      pbVar3 = this->m_L;
      lVar10 = 0;
      do {
        fVar12 = pfVar7[lVar10] * pbVar2[lVar10];
        pfVar6[lVar10] = fVar12;
        pbVar3[iVar11 * iVar1 + lVar10] = fVar12;
        lVar10 = lVar10 + 1;
      } while (lVar5 != lVar10);
    }
    uVar9 = iVar1 - 2;
    fVar12 = 0.0;
    iVar11 = iVar1;
    if (1 < iVar1) {
      do {
        fVar12 = pfVar6[1] * pfVar7[1] + *pfVar6 * *pfVar7 + fVar12;
        pfVar6 = pfVar6 + 2;
        pfVar7 = pfVar7 + 2;
        iVar11 = iVar11 + -2;
      } while (1 < iVar11);
      uVar9 = (iVar1 - (uVar9 & 0xfffffffe)) - 4;
    }
    if (uVar9 == 0xffffffff) {
      fVar12 = fVar12 + *pfVar6 * *pfVar7;
    }
    pbVar2[lVar5] = 1.0 / (this->m_A[i][i] - fVar12);
  }
  btSwapProblem(this->m_A,this->m_x,this->m_b,this->m_w,this->m_lo,this->m_hi,this->m_p,
                this->m_state,this->m_findex,this->m_n,this->m_nC,i,1,in_stack_ffffffffffffffe0);
  iVar1 = this->m_nC;
  this->m_C[iVar1] = iVar1;
  this->m_nN = this->m_nN + -1;
  this->m_nC = iVar1 + 1;
  return;
}

Assistant:

void btLCP::transfer_i_from_N_to_C (int i)
{
  {
    if (m_nC > 0) {
      {
        btScalar *const aptr = BTAROW(i);
        btScalar *Dell = m_Dell;
        const int *C = m_C;
#   ifdef BTNUB_OPTIMIZATIONS
        // if nub>0, initial part of aptr unpermuted
        const int nub = m_nub;
        int j=0;
        for ( ; j<nub; ++j) Dell[j] = aptr[j];
        const int nC = m_nC;
        for ( ; j<nC; ++j) Dell[j] = aptr[C[j]];
#   else
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) Dell[j] = aptr[C[j]];
#   endif
      }
      btSolveL1 (m_L,m_Dell,m_nC,m_nskip);
      {
        const int nC = m_nC;
        btScalar *const Ltgt = m_L + nC*m_nskip;
        btScalar *ell = m_ell, *Dell = m_Dell, *d = m_d;
        for (int j=0; j<nC; ++j) Ltgt[j] = ell[j] = Dell[j] * d[j];
      }
      const int nC = m_nC;
      m_d[nC] = btRecip (BTAROW(i)[i] - btLargeDot(m_ell,m_Dell,nC));
    }
    else {
      m_d[0] = btRecip (BTAROW(i)[i]);
    }

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,m_nC,i,m_nskip,1);

    const int nC = m_nC;
    m_C[nC] = nC;
    m_nN--;
    m_nC = nC + 1; // nC value is outdated after this line
  }

  // @@@ TO DO LATER
  // if we just finish here then we'll go back and re-solve for
  // delta_x. but actually we can be more efficient and incrementally
  // update delta_x here. but if we do this, we wont have ell and Dell
  // to use in updating the factorization later.

}